

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::_::ChainPromiseNode> __thiscall
kj::heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
          (kj *this,Own<kj::_::PromiseNode> *params)

{
  ChainPromiseNode *this_00;
  Own<kj::_::PromiseNode> *other;
  ChainPromiseNode *extraout_RDX;
  Own<kj::_::ChainPromiseNode> OVar1;
  Own<kj::_::PromiseNode> local_28;
  NoInfer<kj::Own<kj::_::PromiseNode>_> *local_18;
  Own<kj::_::PromiseNode> *params_local;
  
  local_18 = params;
  params_local = (Own<kj::_::PromiseNode> *)this;
  this_00 = (ChainPromiseNode *)operator_new(0x50);
  other = fwd<kj::Own<kj::_::PromiseNode>>(local_18);
  Own<kj::_::PromiseNode>::Own(&local_28,other);
  _::ChainPromiseNode::ChainPromiseNode(this_00,&local_28);
  Own<kj::_::ChainPromiseNode>::Own
            ((Own<kj::_::ChainPromiseNode> *)this,this_00,
             (Disposer *)&_::HeapDisposer<kj::_::ChainPromiseNode>::instance);
  Own<kj::_::PromiseNode>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}